

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# JSONWorker.cpp
# Opt level: O1

char * private_RemoveWhiteSpace<true>(json_string *value_t,bool escapeQuotes,size_t *len)

{
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  *paVar1;
  int iVar2;
  byte *pbVar3;
  byte *pbVar4;
  byte *pbVar5;
  byte bVar6;
  byte *pbVar7;
  byte *pbVar8;
  json_string local_50;
  
  pbVar3 = (byte *)malloc(value_t->_M_string_length + 1);
  paVar1 = &local_50.field_2;
  local_50.field_2._M_allocated_capacity._0_5_ = 0x6f2074754f;
  local_50.field_2._M_allocated_capacity._5_3_ = 0x6d2066;
  local_50.field_2._8_5_ = 0x79726f6d65;
  local_50._M_string_length = 0xd;
  local_50.field_2._M_local_buf[0xd] = '\0';
  local_50._M_dataplus._M_p = (pointer)paVar1;
  JSONDebug::_JSON_ASSERT(pbVar3 != (byte *)0x0,&local_50);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_50._M_dataplus._M_p != paVar1) {
    operator_delete(local_50._M_dataplus._M_p);
  }
  if (jsonSingletonERROR_OUT_OF_MEMORY::getValue[abi:cxx11]()::single == '\0') {
    private_RemoveWhiteSpace<true>();
  }
  JSONDebug::_JSON_ASSERT
            (pbVar3 != (byte *)0x0,
             (json_string *)jsonSingletonERROR_OUT_OF_MEMORY::getValue[abi:cxx11]()::single);
  iVar2 = 2;
  pbVar7 = pbVar3;
  if (value_t->_M_string_length != 0) {
    pbVar5 = (byte *)(value_t->_M_dataplus)._M_p;
    pbVar4 = pbVar5 + value_t->_M_string_length;
    do {
      bVar6 = *pbVar5;
      if (0x21 < bVar6) {
        if (bVar6 == 0x22) {
          *pbVar7 = 0x22;
          pbVar7 = pbVar7 + 1;
          pbVar8 = pbVar5;
          while( true ) {
            pbVar5 = pbVar8 + 1;
            bVar6 = pbVar8[1];
            if (bVar6 == 0x22) break;
            if (pbVar5 == pbVar4) goto LAB_001165fc;
            if (bVar6 == 0x5c) {
              *pbVar7 = 0x5c;
              bVar6 = pbVar8[2];
              if ((escapeQuotes) && (bVar6 == 0x22)) {
                used_ascii_one = true;
                bVar6 = 1;
              }
              pbVar7[1] = bVar6;
              pbVar7 = pbVar7 + 2;
              pbVar8 = pbVar8 + 2;
            }
            else {
              *pbVar7 = bVar6;
              pbVar7 = pbVar7 + 1;
              pbVar8 = pbVar5;
            }
          }
          goto LAB_00116588;
        }
        if (bVar6 == 0x23) {
LAB_001165b4:
          *pbVar7 = 0x23;
          while( true ) {
            pbVar8 = pbVar7 + 1;
            pbVar5 = pbVar5 + 1;
            if ((pbVar5 == pbVar4) || (*pbVar5 == 10)) break;
            *pbVar8 = *pbVar5;
            pbVar7 = pbVar8;
          }
          *pbVar8 = 0x23;
          pbVar7 = pbVar7 + 2;
          goto LAB_001165db;
        }
        if (bVar6 != 0x2f) goto LAB_00116588;
        if (pbVar5[1] == 0x2a) {
          *pbVar7 = 0x23;
          pbVar7 = pbVar7 + 2;
          for (pbVar5 = pbVar5 + 3; (pbVar5[-1] != 0x2a || (*pbVar5 != 0x2f)); pbVar5 = pbVar5 + 1)
          {
            if (pbVar5 + -1 == pbVar4) {
              pbVar7[-1] = 0x23;
              goto LAB_001165fc;
            }
            pbVar7[-1] = pbVar5[-1];
            pbVar7 = pbVar7 + 1;
          }
          pbVar7[-1] = 0x23;
          goto LAB_001165db;
        }
        if (pbVar5[1] == 0x2f) {
          pbVar5 = pbVar5 + 1;
          goto LAB_001165b4;
        }
        local_50._M_dataplus._M_p = (pointer)paVar1;
        std::__cxx11::string::_M_construct<char_const*>
                  ((string *)&local_50,"stray / character, not quoted, or a comment","");
LAB_00116678:
        JSONDebug::_JSON_FAIL(&local_50);
        if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)local_50._M_dataplus._M_p != paVar1) {
          operator_delete(local_50._M_dataplus._M_p);
        }
LAB_001165fc:
        iVar2 = 8;
        break;
      }
      if (((1 < bVar6 - 9) && (bVar6 != 0xd)) && (bVar6 != 0x20)) {
LAB_00116588:
        bVar6 = *pbVar5;
        if (bVar6 < 0x20) {
          local_50._M_dataplus._M_p = (pointer)paVar1;
          std::__cxx11::string::_M_construct<char_const*>
                    ((string *)&local_50,"Invalid JSON character detected (lo)","");
        }
        else {
          if (bVar6 < 0x7f) {
            *pbVar7 = bVar6;
            pbVar7 = pbVar7 + 1;
            goto LAB_001165db;
          }
          local_50._M_dataplus._M_p = (pointer)paVar1;
          std::__cxx11::string::_M_construct<char_const*>
                    ((string *)&local_50,"Invalid JSON character detected (hi)","");
        }
        goto LAB_00116678;
      }
LAB_001165db:
      pbVar5 = pbVar5 + 1;
    } while (pbVar5 != pbVar4);
  }
  if ((iVar2 == 2) || (iVar2 == 8)) {
    *len = (long)pbVar7 - (long)pbVar3;
  }
  return (char *)pbVar3;
}

Assistant:

json_char * private_RemoveWhiteSpace(const json_string & value_t, bool escapeQuotes, size_t & len) json_nothrow {
#endif
	json_char * result;
	json_char * runner = result = json_malloc<json_char>(value_t.length() + 1);  //dealing with raw memory is faster than adding to a json_string
	JSON_ASSERT(result != 0, json_global(ERROR_OUT_OF_MEMORY));
	const json_char * const end = value_t.data() + value_t.length();
	for(const json_char * p = value_t.data(); p != end; ++p){
	  switch(*p){
		 case JSON_TEXT(' '):   //defined as white space
		 case JSON_TEXT('\t'):  //defined as white space
		 case JSON_TEXT('\n'):  //defined as white space
		 case JSON_TEXT('\r'):  //defined as white space
			break;
		#ifndef JSON_STRICT
			case JSON_TEXT('/'):  //a C comment
				if (*(++p) == JSON_TEXT('*')){  //a multiline comment
				   if (T) COMMENT_DELIMITER();
				   while ((*(++p) != JSON_TEXT('*')) || (*(p + 1) != JSON_TEXT('/'))){
					  if(p == end){
							COMMENT_DELIMITER(); 
							goto endofrunner;
						}
					  if (T) *runner++ = *p;
				   }
				   ++p;
				   if (T) COMMENT_DELIMITER();
				   break;
				}
				//Should be a single line C comment, so let it fall through to use the bash comment stripper
				JSON_ASSERT_SAFE(*p == JSON_TEXT('/'), JSON_TEXT("stray / character, not quoted, or a comment"), goto endofrunner;);
			case JSON_TEXT('#'):  //a bash comment
				if (T){
					SingleLineComment(p, end AND_RUNNER);
				} else {
					SingleLineComment(p, end);
				}
				break;
		 #endif
		 case JSON_TEXT('\"'):  //a quote
			*runner++ = JSON_TEXT('\"');
			while(*(++p) != JSON_TEXT('\"')){  //find the end of the quotation, as white space is preserved within it
				if(p == end) goto endofrunner;
				switch(*p){
				   case JSON_TEXT('\\'):
					  *runner++ = JSON_TEXT('\\');
					  if (escapeQuotes){
							*runner++ = (*++p == JSON_TEXT('\"')) ? ascii_one() : *p;  //an escaped quote will reak havoc will all of my searching functions, so change it into an illegal character in JSON for convertion later on
					  } else {
							*runner++ = *++p;
					  }
					  break;
				   default:
					  *runner++ = *p;
					  break;
				}
			}
			//no break, let it fall through so that the trailing quote gets added
		 default:
			JSON_ASSERT_SAFE((json_uchar)*p >= 32, JSON_TEXT("Invalid JSON character detected (lo)"), goto endofrunner;);
			JSON_ASSERT_SAFE((json_uchar)*p <= 126, JSON_TEXT("Invalid JSON character detected (hi)"), goto endofrunner;);
			*runner++ = *p;
			break;
	  }
	}
	endofrunner:
	len = runner - result;
	return result;
}